

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_decompress.c
# Opt level: O0

void output_symbol(byte_t symbol)

{
  byte_t symbol_local;
  
  output_buffer[output_byte_idx] = symbol;
  output_byte_idx = output_byte_idx + 1;
  return;
}

Assistant:

void output_symbol(byte_t symbol) {
#ifdef _DEBUG
    log_debug("  output_symbol", "%s in_bit_idx=%-8u\n",
            fmt_symbol(symbol),
            in_bit_idx);
#endif

    output_buffer[output_byte_idx] = symbol;
    output_byte_idx++;
}